

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

void bloaty::ReadGeneralDIEAttr(uint16_t tag,AttrValue val,CU *cu,GeneralDIE *die)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  unsigned_long *puVar4;
  long in_RDX;
  ushort in_DI;
  optional<unsigned_long> oVar5;
  optional<unsigned_long> uint_4;
  optional<unsigned_long> uint_3;
  optional<unsigned_long> uint_2;
  optional<unsigned_long> uint_1;
  optional<unsigned_long> uint;
  CU *in_stack_fffffffffffffec8;
  FILE *__stream;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  AttrValue *this;
  undefined4 in_stack_fffffffffffffee0;
  undefined8 local_118;
  undefined8 local_110;
  CU *in_stack_ffffffffffffff08;
  AttrValue *in_stack_ffffffffffffff10;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined7 uStack_9f;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_58;
  undefined8 local_50;
  
  this = (AttrValue *)&stack0x00000008;
  uVar3 = (uint)in_DI;
  if (uVar3 == 2) {
    bVar1 = dwarf::AttrValue::IsString(this);
    if (bVar1) {
      dwarf::AttrValue::GetString
                ((AttrValue *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
      std::optional<std::basic_string_view<char,std::char_traits<char>>>::operator=
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 CONCAT44(uVar3,in_stack_fffffffffffffee0),
                 (basic_string_view<char,_std::char_traits<char>_> *)this);
    }
    else {
      uVar2 = dwarf::AttrValue::form(this);
      if (uVar2 == 0x17) {
        dwarf::AttrValue::GetUint
                  (this,(CU *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        std::optional<unsigned_long>::optional<unsigned_long,_true>
                  ((optional<unsigned_long> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (unsigned_long *)in_stack_fffffffffffffec8);
        *(undefined8 *)(in_RDX + 0x30) = local_58;
        *(undefined8 *)(in_RDX + 0x38) = local_50;
      }
    }
  }
  else if (uVar3 == 3) {
    bVar1 = dwarf::AttrValue::IsString(this);
    if (bVar1) {
      dwarf::AttrValue::GetString
                ((AttrValue *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
      std::optional<std::basic_string_view<char,std::char_traits<char>>>::operator=
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 CONCAT44(uVar3,in_stack_fffffffffffffee0),
                 (basic_string_view<char,_std::char_traits<char>_> *)this);
    }
  }
  else if (uVar3 == 0x10) {
    dwarf::AttrValue::ToUint(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x208700);
    if (bVar1) {
      std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x208713);
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (unsigned_long *)in_stack_fffffffffffffec8);
      *(undefined8 *)(in_RDX + 0x70) = local_c8;
      *(undefined8 *)(in_RDX + 0x78) = local_c0;
    }
  }
  else if (uVar3 == 0x11) {
    dwarf::AttrValue::ToUint(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x208567);
    if (bVar1) {
      std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x20857a);
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (unsigned_long *)in_stack_fffffffffffffec8);
      *(undefined8 *)(in_RDX + 0x40) = local_80;
      *(undefined8 *)(in_RDX + 0x48) = local_78;
    }
  }
  else if (uVar3 == 0x12) {
    uVar2 = dwarf::AttrValue::form(this);
    uVar3 = (uint)uVar2;
    if (uVar2 != 1) {
      if ((uVar3 - 5 < 3) || (uVar3 == 0xb)) {
        oVar5 = dwarf::AttrValue::ToUint(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        ((_Storage<unsigned_long,_true> *)(in_RDX + 0x60))->_M_value =
             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        *(ulong *)(in_RDX + 0x68) =
             CONCAT71(uStack_9f,
                      oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged);
        return;
      }
      if ((uVar3 != 0x1b) && (3 < uVar3 - 0x29)) {
        if (verbose_level < 1) {
          return;
        }
        __stream = _stderr;
        uVar2 = dwarf::AttrValue::form(this);
        fprintf(__stream,"Unexpected form for high_pc: %d\n",(ulong)uVar2);
        return;
      }
    }
    dwarf::AttrValue::GetUint(this,(CU *)(ulong)CONCAT24(uVar2,in_stack_fffffffffffffed0));
    std::optional<unsigned_long>::optional<unsigned_long,_true>
              ((optional<unsigned_long> *)CONCAT44(uVar3,in_stack_fffffffffffffed0),
               (unsigned_long *)in_stack_fffffffffffffec8);
    *(undefined8 *)(in_RDX + 0x50) = local_90;
    *(undefined8 *)(in_RDX + 0x58) = local_88;
  }
  else if (uVar3 == 0x2c) {
    dwarf::AttrValue::ToUint(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x208818);
    if (bVar1) {
      std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x208828);
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (unsigned_long *)in_stack_fffffffffffffec8);
      *(undefined8 *)(in_RDX + 0xa0) = local_118;
      *(undefined8 *)(in_RDX + 0xa8) = local_110;
    }
  }
  else if (uVar3 == 0x3c) {
    dwarf::AttrValue::ToUint(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x208454);
    if (bVar1) {
      puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x208467);
      *(bool *)(in_RDX + 0xb0) = *puVar4 != 0;
    }
  }
  else if (uVar3 == 0x55) {
    dwarf::AttrValue::ToUint(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x208764);
    if (bVar1) {
      uVar2 = dwarf::AttrValue::form(this);
      if (uVar2 == 0x23) {
        std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x208789);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (unsigned_long *)in_stack_fffffffffffffec8);
        *(undefined8 *)(in_RDX + 0x80) = local_e8;
        *(undefined8 *)(in_RDX + 0x88) = local_e0;
      }
      else {
        std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x2087c2);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (unsigned_long *)in_stack_fffffffffffffec8);
        *(CU **)(in_RDX + 0x90) = in_stack_ffffffffffffff08;
        *(AttrValue **)(in_RDX + 0x98) = in_stack_ffffffffffffff10;
      }
    }
  }
  return;
}

Assistant:

void ReadGeneralDIEAttr(uint16_t tag, dwarf::AttrValue val, const dwarf::CU& cu,
                        GeneralDIE* die) {
  switch (tag) {
    case DW_AT_name:
      if (val.IsString()) {
        die->name = val.GetString(cu);
      }
      break;
    case DW_AT_declaration:
      if (auto uint = val.ToUint(cu)) {
        die->declaration = *uint;
      }
      break;
    case DW_AT_location:
      if (val.IsString()) {
        die->location_string = val.GetString(cu);
      } else if (val.form() == DW_FORM_sec_offset) {
        die->location_uint64 = val.GetUint(cu);
      }
      break;
    case DW_AT_low_pc:
      if (auto uint = val.ToUint(cu)) {
        die->low_pc = *uint;
      }
      break;
    case DW_AT_high_pc:
      switch (val.form()) {
        case DW_FORM_addr:
        case DW_FORM_addrx:
        case DW_FORM_addrx1:
        case DW_FORM_addrx2:
        case DW_FORM_addrx3:
        case DW_FORM_addrx4:
          // high_pc is absolute.
          die->high_pc_addr = val.GetUint(cu);
          break;
        case DW_FORM_data1:
        case DW_FORM_data2:
        case DW_FORM_data4:
        case DW_FORM_data8:
          // high_pc is a size.
          die->high_pc_size = val.ToUint(cu);
          break;
        default:
          if (verbose_level > 0) {
            fprintf(stderr, "Unexpected form for high_pc: %d\n", val.form());
          }
          break;
      }
      break;
    case DW_AT_stmt_list:
      if (auto uint = val.ToUint(cu)) {
        die->stmt_list = *uint;
      }
      break;
    case DW_AT_ranges:
      if (auto uint = val.ToUint(cu)) {
        if (val.form() == DW_FORM_rnglistx) {
          die->rnglistx = *uint;
        } else {
          die->ranges = *uint;
        }
      }
      break;
    case DW_AT_start_scope:
      if (auto uint = val.ToUint(cu)) {
        die->start_scope = *uint;
      }
      break;
  }
}